

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-sha2-256.c
# Opt level: O1

PHashSHA2_256 * pp_crypto_hash_sha2_256_new_internal(pboolean is224)

{
  PHashSHA2_256 *ctx;
  
  ctx = (PHashSHA2_256 *)p_malloc0(0x6c);
  if (ctx == (PHashSHA2_256 *)0x0) {
    ctx = (PHashSHA2_256 *)0x0;
  }
  else {
    ctx->is224 = is224;
    p_crypto_hash_sha2_256_reset(ctx);
  }
  return ctx;
}

Assistant:

static PHashSHA2_256 *
pp_crypto_hash_sha2_256_new_internal (pboolean is224)
{
	PHashSHA2_256 *ret;

	if (P_UNLIKELY ((ret = p_malloc0 (sizeof (PHashSHA2_256))) == NULL))
		return NULL;

	ret->is224 = is224;

	p_crypto_hash_sha2_256_reset (ret);

	return ret;
}